

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomSphere *sphere,uint32_t indent,
          bool closing_brace)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t n_01;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t uVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  stringstream ss;
  char local_234;
  string local_230;
  undefined1 local_210 [32];
  _Base_ptr local_1f0;
  size_t local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar6 = indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)sphere & 0xffffffff),n);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_));
  to_string_abi_cxx11_(&local_230,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," Sphere \"",9);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_210 + 0x10;
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  bVar4 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  n_01 = n_00;
  if (bVar4) {
    pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)sphere & 0xffffffff),n_00);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_)
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(\n",2);
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    print_prim_metas_abi_cxx11_
              ((string *)local_210,this + 0x1a10,(PrimMeta *)(ulong)((int)sphere + 1),uVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_));
    uVar6 = extraout_EDX;
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      uVar6 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)sphere & 0xffffffff),uVar6);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_)
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    n_01 = extraout_EDX_01;
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      n_01 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)sphere & 0xffffffff),n_01);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_210._24_8_ = local_210 + 8;
  local_210._8_4_ = _S_red;
  local_210._16_8_ = (_Link_type)0x0;
  local_1e8 = 0;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1f0 = (_Base_ptr)local_210._24_8_;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"radius","");
  uVar6 = (int)sphere + 1;
  print_typed_attr<double>
            (&local_230,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x1e68)
             ,&local_1d8,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  paVar2 = &local_230.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  print_gprim_predefined<tinyusdz::GeomSphere>(&local_230,(GeomSphere *)this,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_230,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  uVar6 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  local_234 = (char)indent;
  if (local_234 != '\0') {
    pprint::Indent_abi_cxx11_(&local_230,(pprint *)((ulong)sphere & 0xffffffff),uVar6);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
  }
  psVar3 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_210,(_Link_type)local_210._16_8_);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string to_string(const GeomSphere &sphere, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(sphere.spec) << " Sphere \""
     << sphere.name << "\"\n";
  if (sphere.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(sphere.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  std::set<std::string> table;

#if 0 // TODO
  if (sphere.propertyNames().size()) {
    // pxrUSD sorts property, so does TinyUSDZ also.
    std::vector<std::string> sortedPropertyNames;
    for (size_t i = 0; i < sphere.propertyNames().size(); i++) {
      sortedPropertyNames.push_back(sphere.propertyNames()[i].str());
    }
    std::sort(sortedPropertyNames.begin(), sortedPropertyNames.end());

    for (size_t i = 0; i < sortedPropertyNames.size(); i++) {
      std::string propName = sortedPropertyNames[i];

      PRINT_TYPED_ATTR(table, propName, sphere.radius, "radius", indent + 1)

      if (emit_gprim_predefined(ss, &sphere, propName, indent + 1, table)) {
        continue;
      }
      if (sphere.props.count(propName)) {
        ss << print_prop(sphere.props.at(propName), propName, indent + 1);
        table.insert(propName);
        continue;
      }

      // not found
      ss << fmt::format(
          "# Property `{}` is described in `properties` Prim metadatum, but "
          "not found in this Prim. Possibly USDC file is corrupted.\n");
    }
  } else {
    // members
    ss << print_typed_attr(sphere.radius, "radius", indent + 1);

    ss << print_gprim_predefined(sphere, indent + 1);

    ss << print_props(sphere.props, indent + 1);
  }
#else

  ss << print_typed_attr(sphere.radius, "radius", indent + 1);

  ss << print_gprim_predefined(sphere, indent + 1);

  ss << print_props(sphere.props, indent + 1);

#endif

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}